

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::ConsoleReporter::test_case_exception
          (ConsoleReporter *this,TestCaseException *e)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  String *pSVar4;
  int local_44;
  int i;
  String *stringified_contexts;
  int num_stringified_contexts;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> DOCTEST_ANON_LOCK_9;
  TestCaseException *e_local;
  ConsoleReporter *this_local;
  
  DOCTEST_ANON_LOCK_9._M_device = (mutex_type *)e;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex);
  if ((this->tc->m_no_output & 1U) == 0) {
    logTestStart(this);
    pcVar2 = String::c_str(&this->tc->m_file);
    (*(this->super_IReporter)._vptr_IReporter[0xe])(this,pcVar2,(ulong)this->tc->m_line," ");
    successOrFailColoredStringToStream
              (this,false,
               ((byte)((DOCTEST_ANON_LOCK_9._M_device)->super___mutex_base)._M_mutex.__size[0x18] &
               1) * 2 + is_check,"SUCCESS");
    poVar3 = Color::operator<<(this->s,Red);
    pcVar2 = "test case THREW exception: ";
    if ((((DOCTEST_ANON_LOCK_9._M_device)->super___mutex_base)._M_mutex.__size[0x18] & 1U) != 0) {
      pcVar2 = "test case CRASHED: ";
    }
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = Color::operator<<(poVar3,Cyan);
    poVar3 = doctest::operator<<(poVar3,(String *)DOCTEST_ANON_LOCK_9._M_device);
    std::operator<<(poVar3,"\n");
    iVar1 = IReporter::get_num_stringified_contexts();
    if (iVar1 != 0) {
      pSVar4 = IReporter::get_stringified_contexts();
      poVar3 = Color::operator<<(this->s,None);
      std::operator<<(poVar3,"  logged: ");
      for (local_44 = iVar1; 0 < local_44; local_44 = local_44 + -1) {
        pcVar2 = "          ";
        if (local_44 == iVar1) {
          pcVar2 = "";
        }
        poVar3 = std::operator<<(this->s,pcVar2);
        poVar3 = doctest::operator<<(poVar3,pSVar4 + (local_44 + -1));
        std::operator<<(poVar3,"\n");
      }
    }
    poVar3 = std::operator<<(this->s,"\n");
    Color::operator<<(poVar3,None);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            DOCTEST_LOCK_MUTEX(mutex)
            if(tc->m_no_output)
                return;

            logTestStart();

            file_line_to_stream(tc->m_file.c_str(), tc->m_line, " ");
            successOrFailColoredStringToStream(false, e.is_crash ? assertType::is_require :
                                                                   assertType::is_check);
            s << Color::Red << (e.is_crash ? "test case CRASHED: " : "test case THREW exception: ")
              << Color::Cyan << e.error_string << "\n";

            int num_stringified_contexts = get_num_stringified_contexts();
            if(num_stringified_contexts) {
                auto stringified_contexts = get_stringified_contexts();
                s << Color::None << "  logged: ";
                for(int i = num_stringified_contexts; i > 0; --i) {
                    s << (i == num_stringified_contexts ? "" : "          ")
                      << stringified_contexts[i - 1] << "\n";
                }
            }
            s << "\n" << Color::None;
        }